

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O0

void __thiscall SBarInfoCommandFlowControl::Reset(SBarInfoCommandFlowControl *this)

{
  bool bVar1;
  SBarInfoCommand **ppSVar2;
  SBarInfoCommand *command;
  iterator __end2;
  iterator __begin2;
  TDeletingArray<SBarInfoCommand_*,_SBarInfoCommand_*> *__range2;
  uint i;
  SBarInfoCommandFlowControl *this_local;
  
  for (__range2._4_4_ = 0; __range2._4_4_ < 2; __range2._4_4_ = __range2._4_4_ + 1) {
    __end2 = TArray<SBarInfoCommand_*,_SBarInfoCommand_*>::begin
                       (&this->commands[__range2._4_4_].
                         super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>);
    command = (SBarInfoCommand *)
              TArray<SBarInfoCommand_*,_SBarInfoCommand_*>::end
                        (&this->commands[__range2._4_4_].
                          super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>);
    while( true ) {
      bVar1 = TIterator<SBarInfoCommand_*>::operator!=
                        (&__end2,(TIterator<SBarInfoCommand_*> *)&command);
      if (!bVar1) break;
      ppSVar2 = TIterator<SBarInfoCommand_*>::operator*(&__end2);
      (*(*ppSVar2)->_vptr_SBarInfoCommand[4])();
      TIterator<SBarInfoCommand_*>::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void	Reset()
		{
			for(unsigned int i = 0;i < 2;i++)
			{
				for(auto command : commands[i])
					command->Reset();
			}
		}